

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_iterator(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_object_t *pgVar2;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_value_t value_03;
  gravity_value_t value_04;
  uint32_t uVar3;
  gravity_fiber_t *fiber;
  uint32_t n;
  gravity_int_t index;
  char local_1068 [8];
  char _buffer [4096];
  gravity_value_t value;
  gravity_string_t *string;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  if (*(int *)((long)&pgVar1->identifier + 4) == 0) {
    value_04.field_1.n = 0;
    value_04.isa = gravity_class_bool;
    gravity_vm_setslot(vm,value_04,rindex);
    vm_local._7_1_ = true;
  }
  else if ((args[1].isa == gravity_class_null) && (args[1].field_1.n == 0)) {
    value_03.field_1.n = 0;
    value_03.isa = gravity_class_int;
    gravity_vm_setslot(vm,value_03,rindex);
    vm_local._7_1_ = true;
  }
  else {
    pgVar2 = args[1].field_1.p;
    if (args[1].isa == gravity_class_int) {
      if ((long)((long)&pgVar2->isa + 1) < (long)(ulong)*(uint *)((long)&pgVar1->identifier + 4)) {
        uVar3 = utf8_charbytes((char *)((long)&pgVar2->isa + (long)&pgVar1->objclass->isa),0);
        value_00.field_1.p = (gravity_object_t *)((long)&pgVar2->isa + (ulong)uVar3);
        value_00.isa = gravity_class_int;
        gravity_vm_setslot(vm,value_00,rindex);
        vm_local._7_1_ = true;
      }
      else {
        value_01.field_1.n = 0;
        value_01.isa = gravity_class_bool;
        gravity_vm_setslot(vm,value_01,rindex);
        vm_local._7_1_ = true;
      }
    }
    else {
      snprintf(local_1068,0x1000,"Iterator expects a numeric value here.");
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1068);
      value_02.field_1.n = 0;
      value_02.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_02,rindex);
      vm_local._7_1_ = false;
    }
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_iterator (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));

    // check for empty string first
    if (string->len == 0) RETURN_VALUE(VALUE_FROM_FALSE, rindex);

    // check for start of iteration
    if (VALUE_ISA_NULL(GET_VALUE(1))) RETURN_VALUE(VALUE_FROM_INT(0), rindex);

    // extract value
    gravity_value_t value = GET_VALUE(1);

    // check error condition
    if (!VALUE_ISA_INT(value)) RETURN_ERROR("Iterator expects a numeric value here.");

    // compute new value
    gravity_int_t index = value.n;
    if (index+1 < string->len) {
        uint32_t n = utf8_charbytes(string->s + index, 0);
        index += n;
    } else {
        RETURN_VALUE(VALUE_FROM_FALSE, rindex);
    }

    // return new iterator
    RETURN_VALUE(VALUE_FROM_INT(index), rindex);
}